

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O3

HRESULT __thiscall
Js::SCAPropBag::InternalAddNoCopy(SCAPropBag *this,LPCWSTR name,charcount_t len,Var value)

{
  BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  HRESULT HVar1;
  InternalString local_48;
  Var local_38;
  Var value_local;
  
  if ((int)len < 0) {
    HVar1 = -0x7ff8fdea;
  }
  else {
    local_38 = value;
    this_00 = Memory::
              RecyclerRootPtr<JsUtil::BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->m_properties);
    HVar1 = 0;
    InternalString::InternalString(&local_48,name,len,'\0');
    JsUtil::
    BaseDictionary<Js::InternalString,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::InternalString,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
              ((BaseDictionary<Js::InternalString,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                *)this_00,&local_48,&local_38);
  }
  return HVar1;
}

Assistant:

HRESULT SCAPropBag::InternalAddNoCopy(LPCWSTR name, charcount_t len, Var value)
    {
        HRESULT hr = S_OK;

        int intLen;
        IfFailGo(UIntToInt(len, &intLen));
        m_properties->Item(InternalString(name, intLen), value);

Error:
        return hr;
    }